

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O2

bool_t memIsZero_fast(void *buf,size_t count)

{
  char *pcVar1;
  ulong uVar2;
  
  for (; 7 < count; count = count - 8) {
    if (*buf != 0) {
      return 0;
    }
    buf = (void *)((long)buf + 8);
  }
  uVar2 = 0;
  do {
    if (count == uVar2) {
      return 1;
    }
    pcVar1 = (char *)((long)buf + uVar2);
    uVar2 = uVar2 + 1;
  } while (*pcVar1 == '\0');
  return 0;
}

Assistant:

bool_t FAST(memIsZero)(const void* buf, size_t count)
{
	ASSERT(memIsValid(buf, count));
	for (; count >= O_PER_W; count -= O_PER_W, buf = (const word*)buf + 1)
		if (*(const word*)buf)
			return FALSE;
	for (; count--; buf = (const octet*)buf + 1)
		if (*(const octet*)buf)
			return FALSE;
	return TRUE;
}